

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::sparse_hashtable(sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<int,_int,_std::hash<int>,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::sparse_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                  *ht,size_type min_buckets_wanted)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  uint uVar4;
  size_type sVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  undefined1 local_29;
  
  sVar5 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          enlarge_threshold_;
  uVar1 = *(undefined4 *)
           ((long)&(ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>
                   .enlarge_threshold_ + 4);
  sVar6 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_threshold_;
  uVar2 = *(undefined4 *)
           ((long)&(ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>
                   .shrink_threshold_ + 4);
  fVar3 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_factor_;
  bVar7 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          consider_shrink_;
  bVar8 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          use_empty_;
  bVar9 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          use_deleted_;
  uVar10 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           field_0x1b;
  uVar4 = (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.shrink_factor_
       = fVar3;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = bVar7;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       bVar8;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_ =
       bVar9;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.field_0x1b =
       uVar10;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.num_ht_copies_
       = uVar4;
  *(int *)&(this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           enlarge_threshold_ = (int)sVar5;
  *(undefined4 *)
   ((long)&(this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           enlarge_threshold_ + 4) = uVar1;
  *(int *)&(this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           shrink_threshold_ = (int)sVar6;
  *(undefined4 *)
   ((long)&(this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
           shrink_threshold_ + 4) = uVar2;
  (this->key_info).delkey = (ht->key_info).delkey;
  this->num_deleted = 0;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::sparsetable
            (&this->table,0,&local_29);
  sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                   (this->table).settings.table_size);
  move_from(this,mover,ht,min_buckets_wanted);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }